

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O3

void internal_insert_commands_before_after(Am_Object *cmd,bool before)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ostream *poVar6;
  Am_Object new_cmd;
  Am_Object execute_command;
  Am_Object this_cmd;
  Am_Value_List orig_cmds;
  Am_Object script_window;
  Am_Value_List sel_list;
  Am_Object undo_db;
  Am_Object scroll_menu;
  Am_Value_List original_command_list;
  Am_Value_List new_cmds;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Value_List local_a0;
  Am_Value_List local_90;
  Am_Object local_80;
  Am_Value_List local_78;
  Am_Object local_68;
  Am_Object local_60;
  Am_Value_List local_58;
  Am_Value_List local_48;
  Am_Object local_38;
  
  Am_Object::Get_Object((Am_Object *)&local_78,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_80,(Am_Slot_Key)&local_78,10);
  Am_Object::~Am_Object((Am_Object *)&local_78);
  pAVar4 = Am_Object::Get(&local_80,Am_UNDO_SCROLL_GROUP,0);
  Am_Object::Am_Object(&local_60,pAVar4);
  pAVar4 = Am_Object::Get(&local_60,0x169,0);
  Am_Value_List::Am_Value_List(&local_78,pAVar4);
  pAVar4 = Am_Object::Get(&local_80,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&local_68,pAVar4);
  Am_Object::Get_Object((Am_Object *)&local_90,(Am_Slot_Key)&local_68,(ulong)Am_UNDO_SCROLL_GROUP);
  pAVar4 = Am_Object::Get((Am_Object *)&local_90,0x169,0);
  Am_Value_List::Am_Value_List(&local_48,pAVar4);
  Am_Object::~Am_Object((Am_Object *)&local_90);
  pAVar4 = Am_Object::Get(&local_80,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_a8,pAVar4);
  pAVar4 = Am_Object::Get(&local_a8,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List(&local_90,pAVar4);
  pAVar4 = Am_Object::Get(&local_a8,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List(&local_58,pAVar4);
  Am_Value_List::Copy(&local_a0);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_a0);
  Am_Object::Set(cmd,0x16c,pAVar5,0);
  Am_Value_List::~Am_Value_List(&local_a0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  Am_Value_List::Copy(&local_a0);
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_a0);
  Am_Object::Set(cmd,AVar1,pAVar5,1);
  Am_Value_List::~Am_Value_List(&local_a0);
  if (before) {
    bVar2 = Am_Value_List::Valid(&local_78);
    if (!bVar2) {
      Am_Value_List::Start(&local_90);
      goto LAB_0021d153;
    }
    pAVar4 = Am_Value_List::Get_First(&local_78);
    Am_Object::Am_Object((Am_Object *)&local_a0,pAVar4);
    pAVar4 = Am_Object::Get((Am_Object *)&local_a0,0xc5,0);
    Am_Object::Am_Object(&local_b0,pAVar4);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_b0);
    bVar2 = Am_Value_List::Start_Member(&local_90,pAVar5);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Lost insert_before cmd ",0x17);
      poVar6 = operator<<((ostream *)&std::cerr,&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," from list ",0xb);
      poVar6 = operator<<(poVar6,&local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," of ",4);
      poVar6 = operator<<(poVar6,&local_a8);
      std::endl<char,std::char_traits<char>>(poVar6);
      Am_Error();
    }
  }
  else {
    bVar2 = Am_Value_List::Valid(&local_78);
    if (!bVar2) {
      Am_Value_List::End(&local_90);
      goto LAB_0021d153;
    }
    uVar3 = Am_Value_List::Length(&local_78);
    pAVar4 = Am_Value_List::Get_Nth(&local_78,uVar3 - 1);
    Am_Object::Am_Object((Am_Object *)&local_a0,pAVar4);
    pAVar4 = Am_Object::Get((Am_Object *)&local_a0,0xc5,0);
    Am_Object::Am_Object(&local_b0,pAVar4);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_b0);
    bVar2 = Am_Value_List::Start_Member(&local_90,pAVar5);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Lost insert_after cmd ",0x16);
      poVar6 = operator<<((ostream *)&std::cerr,&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," from list ",0xb);
      poVar6 = operator<<(poVar6,&local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," of ",4);
      poVar6 = operator<<(poVar6,&local_a8);
      std::endl<char,std::char_traits<char>>(poVar6);
      Am_Error();
    }
    Am_Value_List::Next(&local_90);
  }
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
LAB_0021d153:
  local_a0.data = (Am_Value_List_Data *)0x0;
  local_b0.data = (Am_Object_Data *)0x0;
  Am_Value_List::End(&local_48);
  while( true ) {
    bVar2 = Am_Value_List::First(&local_48);
    if (bVar2) break;
    pAVar4 = Am_Value_List::Get(&local_48);
    Am_Object::operator=((Am_Object *)&local_a0,pAVar4);
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n adding command ",0x11);
      poVar6 = operator<<((ostream *)&std::cout,(Am_Object *)&local_a0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::ostream::flush();
    }
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_a0);
    Am_Value_List::Add(&local_58,pAVar5,Am_TAIL,true);
    Am_Object::Copy_Value_Only(&local_38,(char *)&local_a0);
    Am_Object::operator=(&local_b0,&local_38);
    Am_Object::~Am_Object(&local_38);
    Am_Object::Set(&local_b0,0x154,-10,0);
    pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_b0);
    Am_Value_List::Insert(&local_90,pAVar5,Am_BEFORE,true);
    Am_Value_List::Prev(&local_48);
  }
  renumber_script_commands(&local_90);
  AVar1 = Am_COMMANDS_PROTOTYPES;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_90);
  Am_Object::Set(&local_a8,AVar1,pAVar5,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_90);
  Am_Object::Set(&local_a8,AVar1,pAVar5,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_58);
  Am_Object::Set(&local_a8,AVar1,pAVar5,0);
  am_set_commands_into_script_window(&local_80,&local_a8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Value_List::~Am_Value_List(&local_58);
  Am_Value_List::~Am_Value_List(&local_90);
  Am_Object::~Am_Object(&local_a8);
  Am_Value_List::~Am_Value_List(&local_48);
  Am_Object::~Am_Object(&local_68);
  Am_Value_List::~Am_Value_List(&local_78);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_80);
  return;
}

Assistant:

void
internal_insert_commands_before_after(Am_Object &cmd, bool before)
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object scroll_menu = script_window.Get(Am_UNDO_SCROLL_GROUP);
  Am_Value_List sel_list = scroll_menu.Get(Am_VALUE);
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Value_List new_cmds =
      undo_db.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_VALUE);
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  cmd.Set(Am_OLD_VALUE, orig_cmds.Copy());
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list.Copy(),
          Am_OK_IF_NOT_THERE);

  if (before) {
    if (sel_list.Valid()) {
      Am_Object first_line = sel_list.Get_First();
      Am_Object insert_before = first_line.Get(Am_COMMAND);
      if (!orig_cmds.Start_Member(insert_before))
        Am_ERROR("Lost insert_before cmd " << insert_before << " from list "
                                           << orig_cmds << " of "
                                           << execute_command);
    } else
      orig_cmds.Start();
  } else {
    if (sel_list.Valid()) {
      Am_Object last_line = sel_list.Get_Nth(sel_list.Length() - 1);
      Am_Object insert_after = last_line.Get(Am_COMMAND);
      if (!orig_cmds.Start_Member(insert_after))
        Am_ERROR("Lost insert_after cmd " << insert_after << " from list "
                                          << orig_cmds << " of "
                                          << execute_command);
      orig_cmds.Next();
    } else
      orig_cmds.End();
  }

  //here orig_cmds is set so can insert at the current element

  //commands come in backwards, swap them
  Am_Object this_cmd, new_cmd;
  for (new_cmds.End(); !new_cmds.First(); new_cmds.Prev()) {
    this_cmd = new_cmds.Get();
    if (am_sdebug)
      std::cout << "\n adding command " << this_cmd << std::endl << std::flush;
    original_command_list.Add(this_cmd);
    new_cmd = this_cmd.Copy_Value_Only();
    new_cmd.Set(Am_IMPLEMENTATION_PARENT, Am_IN_A_SCRIPT);
    orig_cmds.Insert(new_cmd, Am_BEFORE);
  }

  //now fix up the numbering
  renumber_script_commands(orig_cmds);

  execute_command.Set(Am_COMMANDS_PROTOTYPES, orig_cmds);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, orig_cmds);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);

  am_set_commands_into_script_window(script_window, execute_command);
}